

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

int64_t util::parse(char *s)

{
  char *pcVar1;
  invalid_argument *piVar2;
  overflow_error *poVar3;
  long local_d0;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  long local_28;
  int64_t ret;
  bool negative;
  char *local_10;
  char *s_local;
  
  local_10 = s;
  if ((s == (char *)0x0) || (*s == '\0')) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"null or empty string argument");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  ret._3_1_ = *s == '-';
  if ((*s == '+') || (*s == '-')) {
    local_10 = s + 1;
  }
  local_28 = 0;
  for (; *local_10 != '\0'; local_10 = local_10 + 1) {
    local_28 = local_28 * 10 - (long)(*local_10 + -0x30);
    if ((*local_10 < '0') || ('9' < *local_10)) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"invalid input string",&local_69);
      pcVar1 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,pcVar1,&local_91);
      std::operator+(local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68);
      std::invalid_argument::invalid_argument(piVar2,(string *)local_48);
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (0 < local_28) {
      poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(poVar3,"overflow occured when parsing");
      __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
  }
  if ((bool)ret._3_1_) {
    local_d0 = local_28;
  }
  else {
    local_d0 = -local_28;
  }
  local_28 = local_d0;
  if (((bool)ret._3_1_ != local_d0 < 0) && (local_d0 != 0)) {
    poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(poVar3,"overflow occured when parsing");
    __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  return local_d0;
}

Assistant:

std::int64_t parse(const char* s)
{
	if (s == nullptr || *s == '\0')
		throw std::invalid_argument("null or empty string argument");

	bool negative = (s[0] == '-');
	if (*s == '+' || *s == '-')
		++s;

	std::int64_t ret = 0;
	while (*s)
	{
		ret = ret * 10 - (*s - '0'); // assume negative since |min| >= |max|

		if (*s < '0' || *s > '9')
			throw std::invalid_argument(std::string("invalid input string") + std::string(s));

		if (ret > 0)
			throw std::overflow_error("overflow occured when parsing");

		++s;
	}
	ret = negative ? ret : -ret;
	if (negative != (ret < 0) && ret != 0)
		throw std::overflow_error("overflow occured when parsing");

	return ret;
}